

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTags(Config *config)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  reference this_00;
  TestCaseInfo *pTVar5;
  reference s;
  pointer ppVar6;
  ReusableStringStream *pRVar7;
  Column *pCVar8;
  size_type newIndent;
  size_type sVar9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagInfo>_>::value,_pair<iterator,_bool>_>
  _Var10;
  allocator<char> local_2c1;
  string local_2c0;
  pluralise local_2a0;
  string local_278;
  Column local_258;
  undefined1 local_228 [8];
  Column wrapper;
  string str;
  undefined1 local_1d0 [8];
  ReusableStringStream rss;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  *tagCount;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  *__range1_1;
  TagInfo local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  local_148;
  _Base_ptr local_f0;
  undefined1 local_e8;
  _Self local_e0;
  _Self local_d8;
  iterator countIt;
  string lcaseTagName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tagName;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  TestCase *testCase;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  undefined1 local_60 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  TestSpec *testSpec;
  Config *config_local;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  uVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    poVar4 = cout();
    std::operator<<(poVar4,"All available tags:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<(poVar4,"Tags for matching test cases:\n");
  }
  clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
         *)&matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_60,testCases,
              (TestSpec *)CONCAT44(extraout_var,iVar2),&config->super_IConfig);
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_60);
  testCase = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_60);
  while (bVar1 = __gnu_cxx::
                 operator==<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                           (&__end1,(__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                     *)&testCase), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator*(&__end1);
    pTVar5 = TestCase::getTestCaseInfo(this_00);
    __end2 = clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pTVar5->tags);
    tagName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&pTVar5->tags);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&tagName), ((bVar1 ^ 0xffU) & 1) != 0) {
      s = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2);
      toLower((string *)&countIt,s);
      local_d8._M_node =
           (_Base_ptr)
           clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)&matchedTestCases.
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(key_type *)&countIt);
      local_e0._M_node =
           (_Base_ptr)
           clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)&matchedTestCases.
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      bVar1 = clara::std::operator==(&local_d8,&local_e0);
      if (bVar1) {
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_188.spellings._M_t._M_impl._0_8_ = 0;
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_188.spellings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_188.count = 0;
        TagInfo::TagInfo(&local_188);
        std::make_pair<std::__cxx11::string&,Catch::TagInfo>
                  (&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&countIt,
                   &local_188);
        _Var10 = std::
                 map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                 ::insert<std::pair<std::__cxx11::string,Catch::TagInfo>>
                           ((map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                             *)&matchedTestCases.
                                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148);
        local_f0 = (_Base_ptr)_Var10.first._M_node;
        local_e8 = _Var10.second;
        local_d8._M_node = local_f0;
        clara::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair(&local_148);
        TagInfo::~TagInfo(&local_188);
      }
      ppVar6 = clara::std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
               ::operator->(&local_d8);
      TagInfo::add(&ppVar6->second,s);
      std::__cxx11::string::~string((string *)&countIt);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  this = &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_1 = clara::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                      *)this);
  tagCount = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
              *)clara::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                       *)this);
  while (bVar1 = clara::std::operator==(&__end1_1,(_Self *)&tagCount), ((bVar1 ^ 0xffU) & 1) != 0) {
    rss.m_oss = (ostream *)
                clara::std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                ::operator*(&__end1_1);
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_1d0);
    pRVar7 = ReusableStringStream::operator<<((ReusableStringStream *)local_1d0,(char (*) [3])"  ");
    str.field_2._12_4_ = clara::std::setw(2);
    pRVar7 = ReusableStringStream::operator<<(pRVar7,(_Setw *)((long)&str.field_2 + 0xc));
    pRVar7 = ReusableStringStream::operator<<(pRVar7,(unsigned_long *)(rss.m_oss + 0x50));
    ReusableStringStream::operator<<(pRVar7,(char (*) [3])"  ");
    ReusableStringStream::str_abi_cxx11_
              ((string *)&wrapper.m_initialIndent,(ReusableStringStream *)local_1d0);
    TagInfo::all_abi_cxx11_(&local_278,(TagInfo *)(rss.m_oss + 0x20));
    clara::TextFlow::Column::Column(&local_258,&local_278);
    pCVar8 = clara::TextFlow::Column::initialIndent(&local_258,0);
    newIndent = clara::std::__cxx11::
                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &wrapper.m_initialIndent);
    pCVar8 = clara::TextFlow::Column::indent(pCVar8,newIndent);
    pCVar8 = clara::TextFlow::Column::width(pCVar8,0x46);
    clara::TextFlow::Column::Column((Column *)local_228,pCVar8);
    clara::TextFlow::Column::~Column(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    poVar4 = cout();
    poVar4 = std::operator<<(poVar4,(string *)&wrapper.m_initialIndent);
    poVar4 = clara::TextFlow::operator<<(poVar4,(Column *)local_228);
    std::operator<<(poVar4,'\n');
    clara::TextFlow::Column::~Column((Column *)local_228);
    std::__cxx11::string::~string((string *)&wrapper.m_initialIndent);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_1d0);
    clara::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator++(&__end1_1);
  }
  poVar4 = cout();
  sVar9 = clara::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)&matchedTestCases.
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"tag",&local_2c1);
  pluralise::pluralise(&local_2a0,sVar9,&local_2c0);
  poVar4 = operator<<(poVar4,&local_2a0);
  poVar4 = std::operator<<(poVar4,'\n');
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  sVar9 = clara::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)&matchedTestCases.
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_60);
  clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          *)&matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  return sVar9;
}

Assistant:

std::size_t listTags( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCase : matchedTestCases ) {
            for( auto const& tagName : testCase.getTestCaseInfo().tags ) {
                std::string lcaseTagName = toLower( tagName );
                auto countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( auto const& tagCount : tagCounts ) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.second.count << "  ";
            auto str = rss.str();
            auto wrapper = Column( tagCount.second.all() )
                                                    .initialIndent( 0 )
                                                    .indent( str.size() )
                                                    .width( CATCH_CONFIG_CONSOLE_WIDTH-10 );
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << '\n' << std::endl;
        return tagCounts.size();
    }